

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

double ** covarianceMatrix(double **x,double *x_mu,double **y,double *y_mu,int start,int end,int n)

{
  uint m;
  uint uVar1;
  double **x_00;
  double **y_00;
  double **x_01;
  double **ppdVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  double *nch;
  long nrh;
  ulong uVar6;
  
  m = (end - start) + 1;
  nrh = (long)(int)m;
  uVar6 = 1;
  x_00 = matrix(1,nrh,1,3);
  y_00 = matrix(1,nrh,1,3);
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  uVar1 = 0;
  if (0 < (int)m) {
    uVar1 = m;
  }
  for (; uVar6 != uVar1 + 1; uVar6 = uVar6 + 1) {
    iVar4 = start + -1 + (int)uVar6;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      x_00[uVar6][uVar5 + 1] = y[iVar4][uVar5 + 1] - y_mu[uVar5 + 1];
      y_00[uVar6][uVar5 + 1] = x[iVar4][uVar5 + 1] - x_mu[uVar5 + 1];
    }
  }
  x_01 = transpose_matrix(x_00,m,n);
  nch = (double *)(ulong)m;
  ppdVar2 = multiply_matrix(x_01,n,m,y_00,m,n);
  uVar6 = (ulong)((int)uVar3 + 1);
  for (uVar3 = 1; uVar5 = 1, uVar3 != uVar6; uVar3 = uVar3 + 1) {
    for (; n + 1 != uVar5; uVar5 = uVar5 + 1) {
      nch = ppdVar2[uVar3];
      nch[uVar5] = nch[uVar5] / (double)(end - start);
    }
  }
  free_matrix(y_00,1,nrh,uVar6,(long)nch);
  free_matrix(x_00,1,nrh,uVar6,(long)nch);
  free_matrix(x_01,1,(long)n,uVar6,(long)nch);
  return ppdVar2;
}

Assistant:

double **covarianceMatrix(double **x, double *x_mu, double **y, double *y_mu, int start, int end, int n) {
    int k, l;
    double **tmp;
    double **tmpx;
    double **tmpy;
    double **tmpyT;

    int m = end - start + 1;

    tmpy = matrix(1, m, 1, NP);
    tmpx = matrix(1, m, 1, NP);
    /* precompute the mean matrix of x and y for speed */
    for (k = 1; k <= m; k++) {
        for (l = 1; l <= n; l++) {
            tmpy[k][l] = y[k + start - 1][l] - y_mu[l];  //printf("TMP Y\n");  print_matrix(tmpy,3,3);
            tmpx[k][l] = x[k + start - 1][l] - x_mu[l];  //printf("TMP X\n");  print_matrix(tmpx,3,3);
        }
    }
    tmpyT = transpose_matrix(tmpy, m, n);
    tmp = multiply_matrix(tmpyT, n, m, tmpx, m, n);
    for (k = 1; k <= n; k++) {
        for (l = 1; l <= n; l++)
            tmp[k][l] /= m - 1;  // Why m-1????
    }

    /* cleanup */
    free_matrix(tmpx, 1, m, 1, NP);
    free_matrix(tmpy, 1, m, 1, NP);
    free_matrix(tmpyT, 1, n, 1, m);
    //    if (DEBUG)  printf("\t\tcovariance_matrix()::Covariance Matrix\n"); print_matrix(tmp,3,3);

    return tmp;
}